

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font_glyph * nk_font_find_glyph(nk_font *font,nk_rune unicode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint in_ESI;
  long in_RDI;
  int diff;
  nk_rune t;
  nk_rune f;
  nk_font_config *iter;
  nk_font_glyph *glyph;
  int total_glyphs;
  int count;
  int i;
  long local_30;
  int local_20;
  int local_18;
  nk_font_glyph *local_8;
  
  local_20 = 0;
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x58) == 0)) {
    local_8 = (nk_font_glyph *)0x0;
  }
  else {
    local_8 = *(nk_font_glyph **)(in_RDI + 0x60);
    local_30 = *(long *)(in_RDI + 0x78);
    do {
      iVar3 = nk_range_count(*(nk_rune **)(local_30 + 0x30));
      for (local_18 = 0; local_18 < iVar3; local_18 = local_18 + 1) {
        uVar1 = *(uint *)(*(long *)(local_30 + 0x30) + (long)(local_18 << 1) * 4);
        uVar2 = *(uint *)(*(long *)(local_30 + 0x30) + (long)(local_18 * 2 + 1) * 4);
        if ((uVar1 <= in_ESI) && (in_ESI <= uVar2)) {
          return (nk_font_glyph *)
                 (*(long *)(in_RDI + 0x58) + (ulong)(local_20 + (in_ESI - uVar1)) * 0x30);
        }
        local_20 = (uVar2 - uVar1) + 1 + local_20;
      }
      local_30 = *(long *)(local_30 + 0x48);
    } while (local_30 != *(long *)(in_RDI + 0x78));
  }
  return local_8;
}

Assistant:

NK_API const struct nk_font_glyph*
nk_font_find_glyph(struct nk_font *font, nk_rune unicode)
{
int i = 0;
int count;
int total_glyphs = 0;
const struct nk_font_glyph *glyph = 0;
const struct nk_font_config *iter = 0;

NK_ASSERT(font);
NK_ASSERT(font->glyphs);
NK_ASSERT(font->info.ranges);
if (!font || !font->glyphs) return 0;

glyph = font->fallback;
iter = font->config;
do {count = nk_range_count(iter->range);
for (i = 0; i < count; ++i) {
nk_rune f = iter->range[(i*2)+0];
nk_rune t = iter->range[(i*2)+1];
int diff = (int)((t - f) + 1);
if (unicode >= f && unicode <= t)
return &font->glyphs[((nk_rune)total_glyphs + (unicode - f))];
total_glyphs += diff;
}
} while ((iter = iter->n) != font->config);
return glyph;
}